

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O2

void __thiscall
TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_>::K11Reduced
          (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *this,
          TPZFMatrix<std::complex<long_double>_> *K11,TPZFMatrix<std::complex<long_double>_> *F1)

{
  TPZMatrixSolver<std::complex<long_double>_> *pTVar1;
  longdouble lVar2;
  complex<long_double> alpha;
  complex<long_double> beta;
  long lVar3;
  ostream *poVar4;
  undefined8 local_68;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  undefined6 uStack_4e;
  undefined8 local_48;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined8 local_38;
  undefined2 uStack_30;
  undefined6 uStack_2e;
  
  if (this->fK01IsComputed == false) {
    DecomposeK00(this);
    SimetrizeMatRed(this);
    pTVar1 = ((this->fSolver).fRef)->fPointer;
    (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
              (pTVar1,&this->fK01,&this->fK01,0);
    lVar3 = __dynamic_cast(((this->fSolver).fRef)->fPointer,
                           &TPZMatrixSolver<std::complex<long_double>>::typeinfo,
                           &TPZStepSolver<std::complex<long_double>>::typeinfo,0);
    if (*(long *)(lVar3 + 0xf8) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Address ");
      poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
      poVar4 = std::operator<<(poVar4," Number of singular modes ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    this->fK01IsComputed = true;
  }
  lVar2 = (longdouble)1;
  local_48 = SUB108(-lVar2,0);
  uStack_40 = (undefined2)((unkuint10)-lVar2 >> 0x40);
  local_38 = SUB108((longdouble)0,0);
  uStack_30 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
  local_68 = SUB108(lVar2,0);
  uStack_60 = (undefined2)((unkuint10)lVar2 >> 0x40);
  beta._M_value._10_6_ = uStack_5e;
  beta._M_value._8_2_ = uStack_60;
  beta._M_value._26_6_ = uStack_4e;
  beta._M_value._24_2_ = uStack_30;
  alpha._M_value._10_6_ = uStack_3e;
  alpha._M_value._8_2_ = uStack_40;
  alpha._M_value._26_6_ = uStack_2e;
  alpha._M_value._24_2_ = uStack_30;
  alpha._M_value._0_8_ = local_48;
  alpha._M_value._16_8_ = local_38;
  beta._M_value._0_8_ = local_68;
  beta._M_value._16_8_ = local_38;
  TPZFMatrix<std::complex<long_double>_>::MultAdd
            (&this->fK10,&this->fK01,&this->fK11,K11,alpha,beta,0);
  F1Red(this,F1);
  return;
}

Assistant:

void TPZMatRed<TVar,TSideMatrix>::K11Reduced(TPZFMatrix<TVar> &K11, TPZFMatrix<TVar> &F1)
{
	
	if(!fK01IsComputed)
	{
        DecomposeK00();
		SimetrizeMatRed();
		fSolver->Solve(fK01,fK01);
        TPZStepSolver<TVar> *step = dynamic_cast<TPZStepSolver<TVar> *>(fSolver.operator->());
        if (step->Singular().size())
        {
            std::cout << "Address " << (void *) step << " Number of singular modes " << step->Singular().size() << std::endl;
        }
		fK01IsComputed = true;
	}
	fK10.MultAdd(fK01,fK11,(K11),-1.,1.);
    F1Red(F1);

	return;
}